

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::RasterizationSamplesInstance::verifyImage
          (TestStatus *__return_storage_ptr__,RasterizationSamplesInstance *this,
          ConstPixelBufferAccess *result)

{
  ostringstream *this_00;
  TestLog *log;
  bool bVar1;
  deUint32 dVar2;
  PrimitiveType primitive;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  TextureFormat tcuColorFormat;
  TextureFormat tcuDepthFormat;
  ColorVertexShader vertexShader;
  ColorFragmentShader fragmentShader;
  ReferenceRenderer refRenderer;
  VkPhysicalDeviceProperties deviceProperties;
  Program program;
  TextureFormat local_5b8;
  TextureFormat local_5b0;
  VertexShader local_5a8;
  ColorFragmentShader local_570;
  ReferenceRenderer local_528;
  undefined1 local_478 [744];
  float local_190;
  undefined1 local_138 [196];
  long lStack_74;
  long local_6c;
  LineState local_64;
  bool local_60;
  undefined8 local_5c;
  Program local_48;
  
  dVar2 = getUniqueColorsCount(result);
  local_478._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_478 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\nMin. unique colors expected: ",0x1e);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Unique colors found: ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_478 + 0x78));
  if (dVar2 < 3) {
    local_478._0_8_ = (long)local_478 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_478,"Unique colors out of expected bounds","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_478._0_8_,
               (undefined1 *)(local_478._8_8_ + local_478._0_8_));
  }
  else {
    local_5b8 = ::vk::mapVkFormat(this->m_colorFormat);
    local_5b0.order = CHANNELORDER_LAST;
    local_5b0.type = CHANNELTYPE_LAST;
    rr::VertexShader::VertexShader(&local_5a8,2,2);
    local_5a8._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00cf1f60;
    *(undefined8 *)
     local_5a8.m_inputs.
     super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
     super__Vector_impl_data._M_start = 0;
    (local_5a8.m_outputs.
     super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
     super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
    local_5a8.m_outputs.
    super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
    super__Vector_impl_data._M_start[1].type = GENERICVECTYPE_FLOAT;
    ColorFragmentShader::ColorFragmentShader(&local_570,&local_5b8,&local_5b0);
    local_48.geometryShader = (GeometryShader *)0x0;
    local_48.vertexShader = &local_5a8;
    local_48.fragmentShader = &local_570.super_FragmentShader;
    ReferenceRenderer::ReferenceRenderer
              (&local_528,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,&local_5b8
               ,&local_5b0,&local_48);
    ReferenceRenderer::getViewportState(&local_528);
    local_138._0_4_ = CULLMODE_NONE;
    local_138._4_4_ = PROVOKINGVERTEX_LAST;
    local_138._8_4_ = WINDING_CCW;
    local_138._12_4_ = FILL_LEFT;
    local_138._16_8_ = 0x200000001;
    rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)(local_138 + 0x18))
    ;
    local_138._184_4_ = 1.0;
    local_138._188_8_ = local_478._0_8_;
    lStack_74 = local_478._8_8_;
    local_6c = local_478._16_8_;
    local_64.lineWidth = 1.0;
    local_60 = false;
    local_5c._0_4_ = 0xffffffff;
    local_5c._4_4_ = VIEWPORTORIENTATION_LOWER_LEFT;
    local_138._16_8_ = local_138._16_8_ & 0xffffffff;
    if (this->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
      pIVar3 = Context::getInstanceInterface((this->super_TestInstance).m_context);
      pVVar4 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
      (*pIVar3->_vptr_InstanceInterface[5])(pIVar3,pVVar4,local_478);
      local_138._184_4_ = 3.0;
      if (local_190 <= 3.0) {
        local_138._184_4_ = local_190;
      }
    }
    if (this->m_modeFlags == 0) {
      local_478._0_4_ = R;
      local_478._4_4_ = SNORM_INT8;
      local_478._8_8_ = 0;
      ReferenceRenderer::colorClear(&local_528,(Vec4 *)local_478);
    }
    else {
      local_478._0_4_ = 0x3f800000;
      local_478._4_4_ = SNORM_INT8;
      local_478._8_8_ = 0x3f80000000000000;
      ReferenceRenderer::colorClear(&local_528,(Vec4 *)local_478);
    }
    primitive = mapVkPrimitiveTopology(this->m_primitiveTopology);
    ReferenceRenderer::draw(&local_528,(RenderState *)local_138,primitive,&this->m_vertices);
    log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    ReferenceRenderer::getAccess((PixelBufferAccess *)local_478,&local_528);
    bVar1 = tcu::fuzzyCompare(log,"FuzzyImageCompare","Image comparison",
                              (ConstPixelBufferAccess *)local_478,result,0.05,COMPARE_LOG_RESULT);
    if (!bVar1) {
      local_478._0_8_ = (long)local_478 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_478,"Primitive has unexpected shape","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_478._0_8_,
                 (undefined1 *)(local_478._8_8_ + local_478._0_8_));
      if (local_478._0_8_ != (long)local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
      }
      ReferenceRenderer::~ReferenceRenderer(&local_528);
      rr::FragmentShader::~FragmentShader(&local_570.super_FragmentShader);
      rr::VertexShader::~VertexShader(&local_5a8);
      return __return_storage_ptr__;
    }
    ReferenceRenderer::~ReferenceRenderer(&local_528);
    rr::FragmentShader::~FragmentShader(&local_570.super_FragmentShader);
    rr::VertexShader::~VertexShader(&local_5a8);
    local_478._0_8_ = (long)local_478 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_478,"Primitive rendered, unique colors within expected bounds","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_478._0_8_,
               (undefined1 *)(local_478._8_8_ + local_478._0_8_));
  }
  if (local_478._0_8_ != (long)local_478 + 0x10) {
    operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus RasterizationSamplesInstance::verifyImage (const tcu::ConstPixelBufferAccess& result)
{
	// Verify range of unique pixels
	{
		const deUint32	numUniqueColors = getUniqueColorsCount(result);
		const deUint32	minUniqueColors	= 3;

		tcu::TestLog& log = m_context.getTestContext().getLog();

		log << tcu::TestLog::Message
			<< "\nMin. unique colors expected: " << minUniqueColors << "\n"
			<< "Unique colors found: " << numUniqueColors << "\n"
			<< tcu::TestLog::EndMessage;

		if (numUniqueColors < minUniqueColors)
			return tcu::TestStatus::fail("Unique colors out of expected bounds");
	}

	// Verify shape of the rendered primitive (fuzzy-compare)
	{
		const tcu::TextureFormat	tcuColorFormat	= mapVkFormat(m_colorFormat);
		const tcu::TextureFormat	tcuDepthFormat	= tcu::TextureFormat();
		const ColorVertexShader		vertexShader;
		const ColorFragmentShader	fragmentShader	(tcuColorFormat, tcuDepthFormat);
		const rr::Program			program			(&vertexShader, &fragmentShader);
		ReferenceRenderer			refRenderer		(m_renderSize.x(), m_renderSize.y(), 1, tcuColorFormat, tcuDepthFormat, &program);
		rr::RenderState				renderState		(refRenderer.getViewportState());

		if (m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
		{
			VkPhysicalDeviceProperties deviceProperties;

			m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &deviceProperties);

			// gl_PointSize is clamped to pointSizeRange
			renderState.point.pointSize = deFloatMin(3.0f, deviceProperties.limits.pointSizeRange[1]);
		}

		if (m_modeFlags == 0)
		{
			refRenderer.colorClear(tcu::Vec4(0.0f));
			refRenderer.draw(renderState, mapVkPrimitiveTopology(m_primitiveTopology), m_vertices);
		}
		else
		{
			// For depth/stencil case the primitive is invisible and the surroundings are filled red.
			refRenderer.colorClear(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
			refRenderer.draw(renderState, mapVkPrimitiveTopology(m_primitiveTopology), m_vertices);
		}

		if (!tcu::fuzzyCompare(m_context.getTestContext().getLog(), "FuzzyImageCompare", "Image comparison", refRenderer.getAccess(), result, 0.05f, tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Primitive has unexpected shape");
	}

	return tcu::TestStatus::pass("Primitive rendered, unique colors within expected bounds");
}